

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
           *this,size_t i,piecewise_construct_t *args,tuple<const_int_&> *args_1,tuple<> *args_2)

{
  long lVar1;
  value_type *pvVar2;
  
  lVar1 = *(long *)(this + 8);
  pvVar2 = NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>::
           new_element<phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
                     ((Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *)(this + 0x28),
                      args,args_1,args_2);
  *(value_type **)(lVar1 + i * 8) = pvVar2;
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);
        
#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
        // this check can be costly, so do it only when requested
        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
#endif
    }